

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

links_entry * insert_entry(archive_entry_linkresolver *res,archive_entry *entry)

{
  uint uVar1;
  archive_entry *paVar2;
  dev_t dVar3;
  ulong uVar4;
  ulong uVar5;
  archive_entry *in_RSI;
  archive_entry_linkresolver *in_RDI;
  size_t bucket;
  size_t hash;
  links_entry *le;
  archive_entry *in_stack_ffffffffffffffc8;
  links_entry *local_8;
  
  local_8 = (links_entry *)calloc(1,0x30);
  if (local_8 == (links_entry *)0x0) {
    local_8 = (links_entry *)0x0;
  }
  else {
    paVar2 = archive_entry_clone(in_RSI);
    local_8->canonical = paVar2;
    if (in_RDI->number_buckets * 2 < in_RDI->number_entries) {
      grow_hash(in_RDI);
    }
    dVar3 = archive_entry_dev(in_stack_ffffffffffffffc8);
    uVar4 = archive_entry_ino64(in_RSI);
    uVar5 = (dVar3 ^ uVar4) & in_RDI->number_buckets - 1;
    if (in_RDI->buckets[uVar5] != (links_entry *)0x0) {
      in_RDI->buckets[uVar5]->previous = local_8;
    }
    in_RDI->number_entries = in_RDI->number_entries + 1;
    local_8->next = in_RDI->buckets[uVar5];
    local_8->previous = (links_entry *)0x0;
    in_RDI->buckets[uVar5] = local_8;
    local_8->hash = dVar3 ^ uVar4;
    uVar1 = archive_entry_nlink(in_RSI);
    local_8->links = uVar1 - 1;
  }
  return local_8;
}

Assistant:

static struct links_entry *
insert_entry(struct archive_entry_linkresolver *res,
    struct archive_entry *entry)
{
	struct links_entry *le;
	size_t hash, bucket;

	/* Add this entry to the links cache. */
	le = calloc(1, sizeof(struct links_entry));
	if (le == NULL)
		return (NULL);
	le->canonical = archive_entry_clone(entry);

	/* If the links cache is getting too full, enlarge the hash table. */
	if (res->number_entries > res->number_buckets * 2)
		grow_hash(res);

	hash = (size_t)(archive_entry_dev(entry) ^ archive_entry_ino64(entry));
	bucket = hash & (res->number_buckets - 1);

	/* If we could allocate the entry, record it. */
	if (res->buckets[bucket] != NULL)
		res->buckets[bucket]->previous = le;
	res->number_entries++;
	le->next = res->buckets[bucket];
	le->previous = NULL;
	res->buckets[bucket] = le;
	le->hash = hash;
	le->links = archive_entry_nlink(entry) - 1;
	return (le);
}